

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdKelvinStencilEnable::emulate_mthd(MthdKelvinStencilEnable *this)

{
  _Bool _Var1;
  uint local_14;
  uint32_t err;
  MthdKelvinStencilEnable *this_local;
  
  pgraph_kelvin_check_err19(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  local_14 = (uint)(1 < (this->super_SingleMthdTest).super_MthdTest.val);
  _Var1 = pgraph_in_begin_end(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  if (_Var1) {
    local_14 = local_14 | 4;
  }
  if (local_14 == 0) {
    if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource == 0) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_a =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_a &
           ((uint)(1L << ((byte)this->side & 0x3f)) ^ 0xffffffff) |
           (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val & 1) <<
                 ((byte)this->side & 0x3f));
      pgraph_bundle(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0xd,0,
                    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_a
                    ,true);
    }
  }
  else {
    MthdTest::warn((MthdTest *)this,local_14);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		uint32_t err = 0;
		if (val > 1)
			err |= 1;
		if (pgraph_in_begin_end(&exp))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!exp.nsource) {
				insrt(exp.bundle_stencil_a, side, 1, val);
				pgraph_bundle(&exp, BUNDLE_STENCIL_A, 0, exp.bundle_stencil_a, true);
			}
		}
	}